

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::TSX(CPU *this)

{
  uint8_t uVar1;
  byte bVar2;
  
  uVar1 = this->S;
  this->X = uVar1;
  if (uVar1 == '\0') {
    bVar2 = this->field_0x2e | 0x40;
  }
  else {
    bVar2 = this->field_0x2e & 0xbf;
    if ((char)uVar1 < '\0') {
      bVar2 = bVar2 | 1;
      goto LAB_0010e9fd;
    }
  }
  bVar2 = bVar2 & 0xfe;
LAB_0010e9fd:
  this->field_0x2e = bVar2;
  return;
}

Assistant:

void CPU::TSX() {
	X = S;
	if (X == 0) {
		Z = 1;
	} else {
		Z = 0;
	}
	if (X & (1 << 7)) {
		N = 1;
	} else {
		N = 0;
	}
}